

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# depspawn.cpp
# Opt level: O1

void depspawn::wait_for_all(void)

{
  TaskPool *this;
  ulong uVar1;
  bool bVar2;
  ulong uVar3;
  ulong in_RCX;
  
  this = internal::TP;
  if (internal::TP != (TaskPool *)0x0) {
    do {
      do {
        bVar2 = internal::TaskPool::try_run(this);
      } while (bVar2);
    } while ((this->busy_threads_).super___atomic_base<int>._M_i != 0);
    this->finish_ = true;
    do {
      do {
      } while ((this->thread_pool_).ready_ != false);
    } while ((this->thread_pool_).count_ != 0);
    uVar1 = (anonymous_namespace)::worklist;
    if ((anonymous_namespace)::worklist != 0) {
      for (; uVar3 = internal::Workitem::Pool._32_8_, uVar1 != 0; uVar1 = *(ulong *)(uVar1 + 0x18))
      {
        in_RCX = uVar1;
      }
      do {
        *(ulong *)(in_RCX + 0x18) = uVar3;
        LOCK();
        bVar2 = uVar3 != internal::Workitem::Pool._32_8_;
        uVar1 = (uVar3 & 0xffff000000000000) + 0x1000000000000 | (anonymous_namespace)::worklist;
        if (bVar2) {
          uVar3 = internal::Workitem::Pool._32_8_;
          uVar1 = internal::Workitem::Pool._32_8_;
        }
        internal::Workitem::Pool._32_8_ = uVar1;
        UNLOCK();
      } while (bVar2);
    }
    LOCK();
    (anonymous_namespace)::worklist = 0;
    UNLOCK();
  }
  return;
}

Assistant:

void wait_for_all()
  { Workitem *p, *dp;

#ifdef DEPSPAWN_USE_TBB
    if(internal::master_task) {
      internal::master_task->wait_for_all();
      tbb::task::destroy(*internal::master_task);
      internal::master_task = nullptr;
#else
    if(TP) {
      TP->wait(false);
#endif
      if(worklist != nullptr) {
        for(p = worklist; p; p = p->next) {
          dp = p;
        }
        internal::Workitem::Pool.freeLinkedList(worklist, dp);
      }
      
      worklist = nullptr;
      
      DEPSPAWN_PROFILEACTION(profile_display_results(true));
    }


  }
  
  void wait_for_subtasks(bool priority)
  {
    internal::Workitem * cur_father = enum_thr_spec_father;
    
    //fprintf(stderr, "WFS %s\n", (cur_father == nullptr) ? "0" : "nested");
    
    if (cur_father == nullptr) {
      wait_for_all();
    } else {
      Observer o(priority, cur_father);
    }
  }
  
  void set_task_queue_limit(int limit) noexcept
  {
#ifdef DEPSPAWN_FAST_START
    internal::FAST_THRESHOLD = limit;
    FAST_THRESHOLD_ExplicitlySet = true;
#endif
  }
  
  int get_task_queue_limit() noexcept
  {
#ifdef DEPSPAWN_FAST_START
    return internal::FAST_THRESHOLD;
#else
    return -1;
#endif
  }

  void set_threads(int nthreads)
  {
#ifdef DEPSPAWN_USE_TBB
    tbb_set_threads(nthreads);
    if (nthreads == -1) {
      nthreads = std::thread::hardware_concurrency(); //Reasonable estimation
    }
#else
    if (TP != nullptr) {
      delete TP; // implies TP->wait(false)
      TP = nullptr;
    }
    
//    TP = new TaskPool((nthreads < 0) ? nthreads : (nthreads - 1), false);
//    assert(TP != nullptr);
//    nthreads = TP->nthreads() + 1;
    nthreads = ((nthreads < 0) ? (std::thread::hardware_concurrency() + nthreads) : (nthreads - 1)) + 1;
#endif

    Nthreads = nthreads;
    
#ifdef DEPSPAWN_FAST_START
    if (!FAST_THRESHOLD_ExplicitlySet) {
      FAST_THRESHOLD = 2 * nthreads; //Heuristic
    }
#endif
  }

  int get_num_threads() noexcept
  {
    return Nthreads;
  }

  TaskPool& get_task_pool()
  {
#ifdef DEPSPAWN_USE_TBB
    static TaskPool Null_TP(0, 0, false);
    return Null_TP;
#else
    if(TP == nullptr) {
      TP = new TaskPool(Nthreads - 1, true);
      assert(Nthreads == (TP->nthreads() + 1));
    }
    return *TP;
#endif
  }

  Observer::Observer(bool priority) :
  limit_(worklist),
  cur_father_(enum_thr_spec_father),
  priority_(priority)
  { }
  
  Observer::Observer(bool priority, internal::Workitem *w) :
  limit_(w),
  cur_father_(w),
  priority_(priority)
  { }
  
  Observer::~Observer()
  { std::unordered_set<internal::Workitem *> fathers({cur_father_});
    internal::Workitem *p;
    bool must_reiterate;
    
    ObserversAtWork.fetch_add(1); //disable future attempts to erase Workitems during my activity
    while (eraser_assigned) {
      // Wait for current eraser, if any, to finish
    }
    
    /* if there was a cur_father_, since we are inside it, and limit_ is it or more recent,
     limit_ cannot have been deallocated, so limit_ is a safe limit.
     
     if cur_father_=null and limit_ was deallocated, all previous tasks finished,
     and so we have to execute everything up to the end of the list, which is cur_father_=null.
     
     if cur_father_=null and limit_ was not deallocated, we have to execute
     everything up to limit_, but it could have been deallocated, so null is a safe limit,
     although we are waiting for more task that we should actually do.
     
     Also it is interesting to notice that no Workitem in the high-level critical path can
     be Filling, but Workitems descended from them could.
     */
    
    internal::Workitem * const safe_end = (cur_father_ != nullptr) ? limit_ : nullptr;
    //printf("%p w until %p!=NULL->%p\n", enum_thr_spec_father, cur_father_, limit_);

    //The first round always has priority, i.e., is only devoted to the critical path
    bool priority = true;

    do {
      must_reiterate = false;
      bool helped = false;
  
      // We must begin from worklist because new work we must do may have been spawned
      for (p = worklist; p != safe_end; p = p->next) {
        if (fathers.find(p->father) != fathers.end()) { //Workitem in the critical path
          fathers.insert(p); //it could be the father of other tasks that would have to finish
          if (p->status < Workitem::Status_t::Done) {
            must_reiterate = true;
            bool helped_here = try_to_run(p);
            helped = helped || helped_here;
          }
        } else {
          if (!priority) {
            try_to_run(p);
          }
        }
      }
      
      // While we are able to help with tasks in the critical path, we remain focused on it.
      // Otherwise we adopt the priority specified by the user.
      priority = helped ? priority : priority_;
      
    } while (must_reiterate);
    
    //printf("%p exit\n", enum_thr_spec_father);
    
    ObserversAtWork.fetch_sub(1); //I'm done
  }
  
}